

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DebuggerScope * __thiscall
Js::FunctionBody::GetDiagCatchScopeObjectAt(FunctionBody *this,int byteCodeOffset)

{
  ScopeObjectChain *pSVar1;
  DebuggerScope *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  int index;
  
  pSVar1 = (this->m_sourceInfo).pScopeObjectChain.ptr;
  if ((pSVar1 != (ScopeObjectChain *)0x0) &&
     (this_01 = (pSVar1->pScopeChain).ptr,
     0 < (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count
     )) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    index = 0;
    do {
      pTVar5 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index);
      this_00 = pTVar5->ptr;
      if (this_00 == (DebuggerScope *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x152d,"(debuggerScope)","debuggerScope");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if ((this_00->scopeType - DiagCatchScopeDirect < 3) &&
         (bVar3 = DebuggerScope::IsOffsetInScope(this_00,byteCodeOffset), bVar3)) {
        return this_00;
      }
      index = index + 1;
      this_01 = (((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr;
    } while (index < (this_01->
                     super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
                     count);
  }
  return (DebuggerScope *)0x0;
}

Assistant:

Js::DebuggerScope * FunctionBody::GetDiagCatchScopeObjectAt(int byteCodeOffset)
    {
        if (GetScopeObjectChain())
        {
            for (int i = 0; i < GetScopeObjectChain()->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope *debuggerScope = GetScopeObjectChain()->pScopeChain->Item(i);
                Assert(debuggerScope);

                if (debuggerScope->IsCatchScope() && debuggerScope->IsOffsetInScope(byteCodeOffset))
                {
                    return debuggerScope;
                }
            }
        }
        return nullptr;
    }